

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::updateCoTest(SPxSolverBase<double> *this)

{
  int i;
  Status stat;
  UpdateVector<double> *pUVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  SSVectorBase<double>::setup(&this->theCoPvec->thedelta);
  pUVar1 = this->theCoPvec;
  dVar3 = leavetol(this);
  (this->updateViols).super_IdxSet.num = 0;
  dVar3 = -dVar3;
  for (uVar2 = (ulong)(uint)(pUVar1->thedelta).super_IdxSet.num; 0 < (int)uVar2; uVar2 = uVar2 - 1)
  {
    i = (pUVar1->thedelta).super_IdxSet.idx[uVar2 - 1];
    stat = ((this->super_SPxBasisBase<double>).thedesc.costat)->data[i];
    if (this->theRep * stat < 1) {
      if ((this->m_pricingViolUpToDate == true) &&
         (dVar4 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[i], dVar4 < dVar3)) {
        this->m_pricingViol = dVar4 + this->m_pricingViol;
      }
      dVar4 = coTest(this,i,stat);
      (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[i] = dVar4;
      if (this->sparsePricingEnter == true) {
        if (dVar3 <= dVar4) {
          (this->isInfeasible).data[i] = 0;
        }
        else {
          this->m_pricingViol = this->m_pricingViol - dVar4;
          if ((this->isInfeasible).data[i] == 0) {
            DIdxSet::addIdx(&this->infeasibilities,i);
            (this->isInfeasible).data[i] = 1;
          }
          if (this->hyperPricingEnter != false) {
            DIdxSet::addIdx(&this->updateViols,i);
          }
        }
      }
      else if (dVar4 < dVar3) {
        this->m_pricingViol = this->m_pricingViol - dVar4;
      }
    }
    else {
      (this->isInfeasible).data[i] = 0;
      (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[i] = 0.0;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateCoTest()
{
   theCoPvec->delta().setup();

   const IdxSet& idx = theCoPvec->idx();
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();

   int i;
   updateViols.clear();

   for(i = idx.size() - 1; i >= 0; --i)
   {
      int j = idx.index(i);
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(j);

      if(!isBasic(stat))
      {
         if(m_pricingViolUpToDate && theCoTest[j] < -pricingTol)
            m_pricingViol += theCoTest[j];

         theCoTest[j] = coTest(j, stat);

         if(sparsePricingEnter)
         {
            if(theCoTest[j] < -pricingTol)
            {
               assert(remainingRoundsEnter == 0);
               m_pricingViol -= theCoTest[j];

               if(isInfeasible[j] == SPxPricer<R>::NOT_VIOLATED)
               {
                  //                if( !hyperPricingEnter )
                  infeasibilities.addIdx(j);
                  isInfeasible[j] = SPxPricer<R>::VIOLATED;
               }

               if(hyperPricingEnter)
                  updateViols.addIdx(j);
            }
            else
            {
               // @todo do we need to remove index j from infeasibilitiesCo?
               isInfeasible[j] = SPxPricer<R>::NOT_VIOLATED;
            }
         }
         else if(theCoTest[j] < -pricingTol)
            m_pricingViol -= theCoTest[j];
      }
      else
      {
         isInfeasible[j] = SPxPricer<R>::NOT_VIOLATED;
         theCoTest[j] = 0;
      }
   }
}